

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::Message(char *m1,char *title)

{
  ostream *poVar1;
  
  if (s_DisableMessages) {
    return;
  }
  if (s_MessageCallback != (MessageCallback)0x0) {
    (*s_MessageCallback)(m1,title,&s_DisableMessages,s_MessageCallbackClientData);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,m1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void cmSystemTools::Message(const char* m1, const char *title)
{
  if(s_DisableMessages)
    {
    return;
    }
  if(s_MessageCallback)
    {
    (*s_MessageCallback)(m1, title, s_DisableMessages,
                         s_MessageCallbackClientData);
    return;
    }
  else
    {
    std::cerr << m1 << std::endl << std::flush;
    }

}